

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_4447fb::VectorType::printLeft(VectorType *this,OutputStream *S)

{
  bool bVar1;
  Node *this_00;
  StringView local_78;
  StringView local_68;
  StringView local_58;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  VectorType *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  if ((this->IsPixel & 1U) == 0) {
    Node::print(this->BaseType,S);
    StringView::StringView(&local_58," vector[");
    OutputStream::operator+=(local_18,local_58);
    bVar1 = NodeOrString::isNode(&this->Dimension);
    if (bVar1) {
      this_00 = NodeOrString::asNode(&this->Dimension);
      Node::print(this_00,local_18);
    }
    else {
      bVar1 = NodeOrString::isString(&this->Dimension);
      if (bVar1) {
        local_68 = NodeOrString::asString(&this->Dimension);
        OutputStream::operator+=(local_18,local_68);
      }
    }
    StringView::StringView(&local_78,"]");
    OutputStream::operator+=(local_18,local_78);
  }
  else {
    StringView::StringView(&local_28,"pixel vector[");
    OutputStream::operator+=(local_18,local_28);
    local_38 = NodeOrString::asString(&this->Dimension);
    OutputStream::operator+=(local_18,local_38);
    StringView::StringView(&local_48,"]");
    OutputStream::operator+=(local_18,local_48);
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (IsPixel) {
      S += "pixel vector[";
      S += Dimension.asString();
      S += "]";
    } else {
      BaseType->print(S);
      S += " vector[";
      if (Dimension.isNode())
        Dimension.asNode()->print(S);
      else if (Dimension.isString())
        S += Dimension.asString();
      S += "]";
    }
  }